

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O0

void mxx::tuple_members<3UL,_2UL,_int,_int,_int>::get
               (map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
                *members)

{
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var1;
  MPI_Datatype poVar2;
  mapped_type *ppoVar3;
  MPI_Datatype mpi_dt;
  MPI_Aint displ;
  MPI_Aint elem_adr;
  MPI_Aint t_adr;
  tuple<int,_int,_int> tuple;
  map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  *members_local;
  
  tuple.super__Tuple_impl<0UL,_int,_int,_int>._4_8_ = members;
  std::tuple<int,_int,_int>::tuple<void,_true>((tuple<int,_int,_int> *)((long)&t_adr + 4));
  MPI_Get_address((long)&t_adr + 4,&elem_adr);
  p_Var1 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)((long)&t_adr + 4));
  MPI_Get_address(p_Var1,&displ);
  mpi_dt = (MPI_Datatype)(displ - elem_adr);
  poVar2 = datatype_builder<int>::get_type();
  ppoVar3 = std::
            map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
            ::operator[]((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
                          *)tuple.super__Tuple_impl<0UL,_int,_int,_int>._4_8_,
                         (key_type_conflict *)&mpi_dt);
  *ppoVar3 = poVar2;
  tuple_members<3UL,_1UL,_int,_int,_int>::get
            ((map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
              *)tuple.super__Tuple_impl<0UL,_int,_int,_int>._4_8_);
  return;
}

Assistant:

static void get(std::map<MPI_Aint, MPI_Datatype>& members) {
        // init tuple to get measurement offsets
        // TODO: use null-ref instead of actual instantiation
        std::tuple<Types...> tuple;

        // get member displacement
        MPI_Aint t_adr, elem_adr;
        MPI_Get_address(&tuple, &t_adr);
        MPI_Get_address(&std::get<N-I>(tuple), &elem_adr);
        // byte offset from beginning of tuple
        MPI_Aint displ = elem_adr - t_adr;
        // fill in type
        // TODO: use cached type!?
        MPI_Datatype mpi_dt = datatype_builder<typename std::tuple_element<N-I,std::tuple<Types...>>::type>::get_type(); //std::get<N-I>(datatypes).type();

        // add to map
        members[displ] = mpi_dt;

        // recursively (during compile time) call same function
        tuple_members<N,I-1, Types...>::get(members);
    }